

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

string * __thiscall
Catch::TextFlow::Column::const_iterator::addIndentAndSuffix_abi_cxx11_
          (string *__return_storage_ptr__,const_iterator *this,const_iterator start,
          const_iterator end)

{
  size_t sVar1;
  string *extraout_RDX;
  string *psVar2;
  const_iterator begin;
  const_iterator end_00;
  string local_48;
  
  end_00.m_it = end.m_it._M_current;
  begin.m_it = start.m_it._M_current;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = indentSize(this);
  psVar2 = (string *)0x20;
  std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,(char)sVar1);
  begin.m_string = extraout_RDX;
  end_00.m_string = psVar2;
  AnsiSkippingString::substring_abi_cxx11_(&local_48,&this->m_column->m_string,begin,end_00);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (this->m_addHyphen == true) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Column::const_iterator::addIndentAndSuffix(
            AnsiSkippingString::const_iterator start,
            AnsiSkippingString::const_iterator end ) const {
            std::string ret;
            const auto desired_indent = indentSize();
            // ret.reserve( desired_indent + (end - start) + m_addHyphen );
            ret.append( desired_indent, ' ' );
            // ret.append( start, end );
            ret += m_column.m_string.substring( start, end );
            if ( m_addHyphen ) { ret.push_back( '-' ); }

            return ret;
        }